

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O2

void fio_unsubscribe(subscription_s *s)

{
  fio_lock_i *lock;
  fio_lock_i *lock_00;
  fio_lock_i fVar1;
  channel_s *obj;
  anon_struct_264_5_f7cd9697 *set;
  fio_ch_set__ordered_s_ *pfVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined1 auVar5 [24];
  uintptr_t *puVar6;
  uint64_t hash_value;
  fio_ch_set__map_s_ *pfVar7;
  uintptr_t uVar8;
  fio_ch_set__ordered_s_ *pfVar9;
  fio_engine_set__ordered_s_ *pfVar10;
  fio_lock_i ret_6;
  fio_lock_i ret;
  
  if (s == (subscription_s *)0x0) {
    return;
  }
  LOCK();
  fVar1 = s->unsubscribed;
  s->unsubscribed = '\x01';
  UNLOCK();
  if (fVar1 == '\0') {
    fio_lock(&s->lock);
    obj = s->parent;
    lock = &obj->lock;
    fio_lock(lock);
    fio_ls_embd_remove(&s->node);
    if ((obj->subscriptions).next == &obj->subscriptions) {
      set = (anon_struct_264_5_f7cd9697 *)obj->parent;
      hash_value = fio_siphash13(obj->name,obj->name_len,0x150cc8,0x150cc8);
      lock_00 = &(set->filters).lock;
      fio_lock(lock_00);
      if ((obj->subscriptions).next == &obj->subscriptions) {
        if (((hash_value != 0) &&
            (pfVar7 = fio_ch_set__find_map_pos_((fio_ch_set_s *)set,hash_value,obj),
            pfVar7 != (fio_ch_set__map_s_ *)0x0)) && (pfVar7->pos != (fio_ch_set__ordered_s_ *)0x0))
        {
          fio_channel_free(pfVar7->pos->obj);
          (set->filters).channels.count = (set->filters).channels.count - 1;
          pfVar2 = pfVar7->pos;
          pfVar2->hash = 0;
          uVar8 = (set->filters).channels.pos;
          pfVar9 = (set->filters).channels.ordered;
          if (pfVar2 == pfVar9 + (uVar8 - 1)) {
            pfVar7->hash = 0;
            pfVar9 = pfVar9 + (uVar8 - 2);
            do {
              uVar8 = uVar8 - 1;
              if (uVar8 == 0) break;
              puVar6 = &pfVar9->hash;
              pfVar9 = pfVar9 + -1;
            } while (*puVar6 == 0);
            (set->filters).channels.pos = uVar8;
          }
          pfVar7->pos = (fio_ch_set__ordered_s_ *)0x0;
        }
        LOCK();
        (set->filters).lock = '\0';
        UNLOCK();
        LOCK();
        *lock = '\0';
        UNLOCK();
        if (set != &fio_postoffice) {
          fio_lock(&fio_postoffice.engines.lock);
          for (pfVar10 = fio_postoffice.engines.set.ordered;
              (pfVar10 != (fio_engine_set__ordered_s_ *)0x0 &&
              (pfVar10 < fio_postoffice.engines.set.ordered + fio_postoffice.engines.set.pos));
              pfVar10 = pfVar10 + 1) {
            if (pfVar10->hash != 0) {
              uVar3 = obj->name_len;
              uVar4 = obj->name;
              auVar5._8_8_ = uVar4;
              auVar5._0_8_ = uVar3;
              auVar5._16_8_ = 0;
              (*pfVar10->obj->unsubscribe)(pfVar10->obj,(fio_str_info_s)(auVar5 << 0x40),obj->match)
              ;
            }
          }
          LOCK();
          fio_postoffice.engines.lock = '\0';
          UNLOCK();
          fio_cluster_inform_root_about_channel(obj,0);
        }
      }
      else {
        LOCK();
        *lock_00 = '\0';
        UNLOCK();
        LOCK();
        *lock = '\0';
        UNLOCK();
      }
    }
    else {
      LOCK();
      *lock = '\0';
      UNLOCK();
    }
    s->on_message = (_func_void_fio_msg_s_ptr *)0x0;
    LOCK();
    s->lock = '\0';
    UNLOCK();
  }
  fio_subscription_free(s);
  return;
}

Assistant:

void fio_unsubscribe(subscription_s *s) {
  if (!s)
    return;
  if (fio_trylock(&s->unsubscribed))
    goto finish;
  fio_lock(&s->lock);
  channel_s *ch = s->parent;
  uint8_t removed = 0;
  fio_lock(&ch->lock);
  fio_ls_embd_remove(&s->node);
  /* check if channel is done for */
  if (fio_ls_embd_is_empty(&ch->subscriptions)) {
    fio_collection_s *c = ch->parent;
    uint64_t hashed = FIO_HASH_FN(
        ch->name, ch->name_len, &fio_postoffice.pubsub, &fio_postoffice.pubsub);
    /* lock collection */
    fio_lock(&c->lock);
    /* test again within lock */
    if (fio_ls_embd_is_empty(&ch->subscriptions)) {
      fio_ch_set_remove(&c->channels, hashed, ch, NULL);
      removed = (c != &fio_postoffice.filters);
    }
    fio_unlock(&c->lock);
  }
  fio_unlock(&ch->lock);
  if (removed) {
    fio_pubsub_on_channel_destroy(ch);
  }

  /* promise the subscription will be inactive */
  s->on_message = NULL;
  fio_unlock(&s->lock);
finish:
  fio_subscription_free(s);
}